

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMemSetDouble(Mem *pMem,double val)

{
  if ((pMem->flags & 0x9000) == 0) {
    pMem->flags = 1;
  }
  else {
    vdbeMemClearExternAndSetNull(pMem);
  }
  if ((~(ulong)val & 0x7ff0000000000000) != 0 || ((ulong)val & 0xfffffffffffff) == 0) {
    (pMem->u).r = val;
    pMem->flags = 8;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetDouble(Mem *pMem, double val){
  sqlite3VdbeMemSetNull(pMem);
  if( !sqlite3IsNaN(val) ){
    pMem->u.r = val;
    pMem->flags = MEM_Real;
  }
}